

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

void __thiscall ui::LedPanel::LedPanel(LedPanel *this)

{
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  bool bVar1;
  reference pbVar2;
  element_type *this_00;
  ConstStringListRef entries;
  shared_ptr<ftxui::ComponentBase> *local_230;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_1d1;
  undefined1 local_1d0 [32];
  shared_ptr<ftxui::ComponentBase> local_1b0;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_1a0;
  Component local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pointer psStack_100;
  pointer local_f8;
  Ref<ftxui::RadioboxOption> local_e8;
  ConstStringListRef local_20;
  LedPanel *local_10;
  LedPanel *this_local;
  
  local_10 = this;
  PanelBase::PanelBase(&this->super_PanelBase);
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__LedPanel_00218580;
  this->selected_led_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->names_);
  ftxui::ConstStringListRef::ConstStringListRef(&local_20,&this->names_);
  ftxui::Ref<ftxui::RadioboxOption>::Ref(&local_e8);
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)local_20.ref_;
  entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->radiobox_;
  ftxui::Radiobox(entries,(int *)local_20.ref_wide_,
                  (Ref<ftxui::RadioboxOption> *)&this->selected_led_);
  ftxui::Ref<ftxui::RadioboxOption>::~Ref(&local_e8);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
  psStack_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)&__range2);
  ftxui::Container::Tab
            ((Container *)&this->led_tab_,
             (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
              *)&__range2,&this->selected_led_);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             *)&__range2);
  FindLEDs_abi_cxx11_();
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2);
  name.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&name.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_158,(string *)pbVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->names_,(value_type *)local_158);
    this_00 = std::
              __shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->led_tab_);
    ftxui::Make<ui::Led,std::__cxx11::string&>(&local_178);
    std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ui::Led,void>
              ((shared_ptr<ftxui::ComponentBase> *)&local_178.field_2,
               (shared_ptr<ui::Led> *)&local_178);
    ftxui::ComponentBase::Add(this_00,(Component *)&local_178.field_2);
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr
              ((shared_ptr<ftxui::ComponentBase> *)&local_178.field_2);
    std::shared_ptr<ui::Led>::~shared_ptr((shared_ptr<ui::Led> *)&local_178);
    std::__cxx11::string::~string((string *)local_158);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)local_1d0,&this->radiobox_);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)(local_1d0 + 0x10),&this->led_tab_);
  local_1b0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_1b0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1d0;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_1d1);
  __l._M_len = (size_type)
               local_1b0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_1b0.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_1a0,__l,&local_1d1);
  ftxui::Container::Vertical((Container *)&local_188,&local_1a0);
  ftxui::ComponentBase::Add((ComponentBase *)this,&local_188);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_188);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_1a0);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_1d1);
  local_230 = &local_1b0;
  do {
    local_230 = local_230 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_230);
  } while (local_230 != (shared_ptr<ftxui::ComponentBase> *)local_1d0);
  return;
}

Assistant:

LedPanel() {
    for (auto name : FindLEDs()) {
      names_.push_back(name);
      led_tab_->Add(Make<Led>(name));
    }

    Add(Container::Vertical({
        radiobox_,
        led_tab_,
    }));
  }